

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall
imrt::Collimator::generateIntensityLevels(Collimator *this,int step_intensity,int max_intensity)

{
  vector<int,_std::allocator<int>_> *this_00;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *this_01;
  mapped_type *pmVar1;
  int i;
  int iVar2;
  int local_44;
  key_type_conflict1 local_40;
  Collimator *local_38;
  
  this_00 = &this->levels_to_intensity;
  local_40 = (key_type_conflict1)((ulong)local_40 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_40);
  this_01 = &this->intensity_to_levels;
  local_40 = 0.0;
  local_38 = this;
  pmVar1 = std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::operator[](this_01,&local_40);
  *pmVar1 = 0;
  local_40 = (key_type_conflict1)CONCAT44(local_40._4_4_,1);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_40);
  local_40 = 1.0;
  pmVar1 = std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::operator[](this_01,&local_40);
  *pmVar1 = 1;
  iVar2 = 2;
  local_44 = 1;
  while (local_44 < max_intensity) {
    local_44 = local_44 + step_intensity;
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_44);
    local_40 = (key_type_conflict1)local_44;
    pmVar1 = std::
             map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
             operator[](this_01,&local_40);
    *pmVar1 = iVar2;
    iVar2 = iVar2 + 1;
  }
  printIntensityLevels(local_38);
  return;
}

Assistant:

void Collimator::generateIntensityLevels (int step_intensity, int max_intensity) {
    int aux=0;
    // Level 0 and 1 are always in the set
    levels_to_intensity.push_back(0);
    intensity_to_levels[0.0] = 0;
    levels_to_intensity.push_back(1);
    intensity_to_levels[1.0] = 1;
    aux = 1;

    for (int i=2; aux< max_intensity; i++){
      aux = aux + step_intensity;
      levels_to_intensity.push_back(aux);
      intensity_to_levels[aux] = i;
    }
    printIntensityLevels ();
  }